

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O3

jint Java_beagle_BeagleJNIWrapper_setEigenDecomposition
               (JNIEnv *env,jobject obj,jint instance,jint eigenIndex,jdoubleArray inEigenVectors,
               jdoubleArray inInvEigenVectors,jdoubleArray inEigenValues)

{
  jint jVar1;
  jdouble *pjVar2;
  jdouble *pjVar3;
  jdouble *pjVar4;
  
  pjVar2 = (*env->functions->GetDoubleArrayElements)(env,inEigenVectors,(jboolean *)0x0);
  pjVar3 = (*env->functions->GetDoubleArrayElements)(env,inInvEigenVectors,(jboolean *)0x0);
  pjVar4 = (*env->functions->GetDoubleArrayElements)(env,inEigenValues,(jboolean *)0x0);
  jVar1 = beagleSetEigenDecomposition(instance,eigenIndex,pjVar2,pjVar3,pjVar4);
  (*env->functions->ReleaseDoubleArrayElements)(env,inEigenValues,pjVar4,2);
  (*env->functions->ReleaseDoubleArrayElements)(env,inInvEigenVectors,pjVar3,2);
  (*env->functions->ReleaseDoubleArrayElements)(env,inEigenVectors,pjVar2,2);
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_setEigenDecomposition
(JNIEnv *env, jobject obj, jint instance, jint eigenIndex, jdoubleArray inEigenVectors, jdoubleArray inInvEigenVectors, jdoubleArray inEigenValues)
{
    jdouble *eigenVectors = env->GetDoubleArrayElements(inEigenVectors, NULL);
    jdouble *invEigenVectors = env->GetDoubleArrayElements(inInvEigenVectors, NULL);
    jdouble *eigenValues = env->GetDoubleArrayElements(inEigenValues, NULL);

	jint errCode = (jint)beagleSetEigenDecomposition(instance, eigenIndex, (double *)eigenVectors, (double *)invEigenVectors, (double *)eigenValues);

    env->ReleaseDoubleArrayElements(inEigenValues, eigenValues, JNI_ABORT);
    env->ReleaseDoubleArrayElements(inInvEigenVectors, invEigenVectors, JNI_ABORT);
    env->ReleaseDoubleArrayElements(inEigenVectors, eigenVectors, JNI_ABORT);

    return errCode;
}